

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::setGeneralUniforms
          (FunctionCase *this,deUint32 program)

{
  long lVar1;
  DataType dataType;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 extraout_var;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float values [4];
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  long *local_98;
  ulong local_90;
  long local_88;
  long lStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  long lStack_60;
  FunctionCase *local_38;
  long lVar6;
  
  local_38 = this;
  iVar3 = (*((this->super_OperatorPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pcVar2 = *(code **)(lVar6 + 0x14e0);
  uVar4 = (**(code **)(lVar6 + 0xb48))(program,"u_zero");
  (*pcVar2)(uVar4);
  lVar10 = 0;
  do {
    dataType = local_38->m_paramTypes[lVar10];
    if (dataType != TYPE_INVALID) {
      iVar3 = glu::getDataTypeScalarSize(dataType);
      pcVar2 = *(code **)(lVar6 + 0xb48);
      local_b8 = &local_a8;
      local_b0 = 0;
      local_a8 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_88 = *plVar8;
        lStack_80 = plVar7[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar8;
        local_98 = (long *)*plVar7;
      }
      local_90 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_68 = *plVar8;
        lStack_60 = plVar7[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar8;
        local_78 = (long *)*plVar7;
      }
      uStack_70 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar4 = (*pcVar2)(program,local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
      }
      uVar14 = (uint)lVar10;
      if (dataType < TYPE_FLOAT_MAT2) {
        fVar11 = (float)(int)uVar14 * 0.01;
        local_78 = (long *)CONCAT44(fVar11 + 0.001,fVar11 + 0.0);
        uStack_70 = CONCAT44(fVar11 + 0.003,fVar11 + 0.002);
        if (iVar3 - 1U < 4) {
          (**(code **)(lVar6 + 0x14e8 + (ulong)(iVar3 - 1U) * 0x40))(uVar4,1,&local_78);
        }
      }
      else {
        if (dataType - TYPE_INT < 4) {
          uVar5 = uVar14 * 100;
          uVar12 = uVar5 | 1;
          uVar13 = uVar5 | 2;
          uVar14 = uVar5 | 3;
        }
        else {
          if (3 < dataType - TYPE_BOOL) {
            if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
              iVar3 = glu::getDataTypeMatrixNumRows(dataType);
              fVar11 = (float)(int)uVar14;
              lVar9 = 0;
              auVar15 = _s_validInterpolations;
              do {
                auVar16 = auVar15 & _DAT_01a16490 | _DAT_01a57080;
                auVar17._0_4_ = auVar15._0_4_ >> 0x10;
                uVar14 = auVar15._4_4_;
                auVar17._4_4_ = uVar14 >> 0x10;
                uVar5 = auVar15._8_4_;
                uVar12 = auVar15._12_4_;
                auVar17._8_4_ = uVar5 >> 0x10;
                auVar17._12_4_ = uVar12 >> 0x10;
                auVar17 = auVar17 | _DAT_01a57090;
                lVar1 = lVar9 * 4;
                *(float *)((long)&local_78 + lVar1) =
                     fVar11 * 0.01 + ((auVar17._0_4_ - 5.497642e+11) + auVar16._0_4_) * 0.001;
                *(float *)((long)&local_78 + lVar1 + 4) =
                     fVar11 * 0.01 + ((auVar17._4_4_ - 5.497642e+11) + auVar16._4_4_) * 0.001;
                *(float *)((long)&uStack_70 + lVar1) =
                     fVar11 * 0.01 + ((auVar17._8_4_ - 5.497642e+11) + auVar16._8_4_) * 0.001;
                *(float *)((long)&uStack_70 + lVar1 + 4) =
                     fVar11 * 0.01 + ((auVar17._12_4_ - 5.497642e+11) + auVar16._12_4_) * 0.001;
                lVar9 = lVar9 + 4;
                auVar15._0_4_ = auVar15._0_4_ + 4;
                auVar15._4_4_ = uVar14 + 4;
                auVar15._8_4_ = uVar5 + 4;
                auVar15._12_4_ = uVar12 + 4;
              } while (lVar9 != 0x10);
              if (iVar3 - 2U < 3) {
                (**(code **)(lVar6 + 0x15e0 + (ulong)(iVar3 - 2U) * 0x30))(uVar4,1,0,&local_78);
              }
            }
            goto LAB_0136caa5;
          }
          uVar5 = uVar14 & 1;
          uVar12 = uVar14 >> 1 & 1;
          uVar13 = uVar14 >> 2 & 1;
          uVar14 = uVar14 >> 3 & 1;
        }
        local_78 = (long *)CONCAT44(uVar12,uVar5);
        uStack_70 = CONCAT44(uVar14,uVar13);
        if (iVar3 - 1U < 4) {
          (**(code **)(lVar6 + 0x14f8 + (ulong)(iVar3 - 1U) * 0x40))(uVar4,1,&local_78);
        }
      }
    }
LAB_0136caa5:
    lVar10 = lVar10 + 1;
    if (lVar10 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void FunctionCase::setGeneralUniforms (deUint32 program) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.uniform1f(gl.getUniformLocation(program, "u_zero"), 0.0f);

	for (int paramNdx = 0; paramNdx < MAX_PARAMS; paramNdx++)
	{
		if (m_paramTypes[paramNdx] != glu::TYPE_INVALID)
		{
			const glu::DataType		paramType	= m_paramTypes[paramNdx];
			const int				scalarSize	= glu::getDataTypeScalarSize(paramType);
			const int				location	= gl.getUniformLocation(program, (string() + "u_inc" + (char)('A'+paramNdx)).c_str());

			if (glu::isDataTypeFloatOrVec(paramType))
			{
				float values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary small values.
				uniformNfv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeIntOrIVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = paramNdx*100 + i; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeBoolOrBVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (paramNdx >> i) & 1; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeMatrix(paramType))
			{
				const int size = glu::getDataTypeMatrixNumRows(paramType);
				DE_ASSERT(size == glu::getDataTypeMatrixNumColumns(paramType));
				float values[4*4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary values.
				uniformMatrixNfv(gl, size, location, 1, &values[0]);
			}
			else
				DE_ASSERT(false);
		}
	}
}